

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result.hpp
# Opt level: O0

void baryonyx::convert<baryonyx::itm::minimize_tag>
               (raw_result<baryonyx::itm::minimize_tag> *source,solution *sol,int variables)

{
  int iVar1;
  reference pvVar2;
  int local_20;
  int i;
  int variables_local;
  solution *sol_local;
  raw_result<baryonyx::itm::minimize_tag> *source_local;
  
  sol->value = source->value;
  std::vector<signed_char,_std::allocator<signed_char>_>::resize(&sol->variables,(long)variables);
  for (local_20 = 0; local_20 != variables; local_20 = local_20 + 1) {
    iVar1 = bit_array::operator[](&source->x,local_20);
    pvVar2 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                       (&sol->variables,(long)local_20);
    *pvVar2 = (value_type)iVar1;
  }
  return;
}

Assistant:

void
convert(const raw_result<Mode>& source, solution& sol, int variables)
{
    sol.value = source.value;
    sol.variables.resize(variables);

    for (int i = 0; i != variables; ++i)
        sol.variables[i] = static_cast<var_value>(source.x[i]);
}